

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep.c
# Opt level: O0

int arkStep_StageSetup(ARKodeMem ark_mem,int implicit)

{
  sunrealtype *psVar1;
  N_Vector *pp_Var2;
  int iVar3;
  int in_ESI;
  void *in_RDI;
  N_Vector *Xvecs;
  sunrealtype *cvals;
  sunrealtype **Aij;
  sunrealtype *cj;
  int nvec;
  int jmax;
  int j;
  int i;
  int retval;
  ARKodeARKStepMem step_mem;
  double local_60;
  sunrealtype **local_48;
  sunrealtype *local_40;
  uint local_34;
  int local_30;
  int local_2c;
  int local_28;
  undefined4 local_24;
  ARKodeARKStepMem local_20;
  int local_14;
  void *local_10;
  int local_4;
  
  if (*(long *)((long)in_RDI + 0x88) == 0) {
    arkProcessError((ARKodeMem)0x0,-0x15,0xab7,"arkStep_StageSetup",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_arkstep.c"
                    ,"Time step module memory is NULL.");
    local_4 = -0x15;
  }
  else {
    local_20 = *(ARKodeARKStepMem *)((long)in_RDI + 0x88);
    local_28 = local_20->istage;
    psVar1 = local_20->cvals;
    pp_Var2 = local_20->Xvecs;
    if (in_ESI != 0) {
      local_20->gamma = *(double *)((long)in_RDI + 0x2a0) * local_20->Bi->A[local_28][local_28];
      if (*(int *)((long)in_RDI + 0x394) != 0) {
        local_20->gammap = local_20->gamma;
      }
      if (*(int *)((long)in_RDI + 0x394) == 0) {
        local_60 = local_20->gamma / local_20->gammap;
      }
      else {
        local_60 = 1.0;
      }
      local_20->gamrat = local_60;
    }
    local_34 = 0;
    local_14 = in_ESI;
    local_10 = in_RDI;
    if (in_ESI != 0) {
      N_VLinearSum(0x3ff0000000000000,0xbff0000000000000,*(undefined8 *)((long)in_RDI + 0x230),
                   local_20->zpred,local_20->sdata);
      *psVar1 = 1.0;
      *pp_Var2 = local_20->sdata;
    }
    local_34 = (uint)(in_ESI != 0);
    if ((local_14 != 0) && (local_20->mass_type == 1)) {
      N_VScale(0x3ff0000000000000,local_20->sdata,*(undefined8 *)((long)local_10 + 0x248));
      iVar3 = (*local_20->mmult)(local_10,*(N_Vector *)((long)local_10 + 0x248),local_20->sdata);
      if (iVar3 != 0) {
        return -0x12;
      }
      local_24 = 0;
    }
    if (local_20->explicit != 0) {
      for (local_2c = 0; local_2c < local_28; local_2c = local_2c + 1) {
        psVar1[(int)local_34] =
             *(double *)((long)local_10 + 0x2a0) * local_20->Be->A[local_28][local_2c];
        pp_Var2[(int)local_34] = local_20->Fe[local_2c];
        local_34 = local_34 + 1;
      }
    }
    if (local_20->implicit != 0) {
      for (local_2c = 0; local_2c < local_28; local_2c = local_2c + 1) {
        psVar1[(int)local_34] =
             *(double *)((long)local_10 + 0x2a0) * local_20->Bi->A[local_28][local_2c];
        pp_Var2[(int)local_34] = local_20->Fi[local_2c];
        local_34 = local_34 + 1;
      }
    }
    if ((local_20->expforcing != 0) || (local_20->impforcing != 0)) {
      if (local_20->expforcing == 0) {
        local_30 = local_28 + 1;
        local_48 = local_20->Bi->A;
        local_40 = local_20->Bi->c;
      }
      else {
        local_30 = local_28;
        local_48 = local_20->Be->A;
        local_40 = local_20->Be->c;
      }
      for (local_2c = 0; local_2c < local_30; local_2c = local_2c + 1) {
        local_20->stage_times[local_2c] =
             local_40[local_2c] * *(double *)((long)local_10 + 0x2a0) +
             *(double *)((long)local_10 + 0x360);
        local_20->stage_coefs[local_2c] =
             *(double *)((long)local_10 + 0x2a0) * local_48[local_28][local_2c];
      }
      arkStep_ApplyForcing
                (local_20,local_20->stage_times,local_20->stage_coefs,local_30,(int *)&local_34);
    }
    iVar3 = N_VLinearCombination(local_34,psVar1,pp_Var2,local_20->sdata);
    if (iVar3 == 0) {
      local_4 = 0;
    }
    else {
      local_4 = -0x1c;
    }
  }
  return local_4;
}

Assistant:

int arkStep_StageSetup(ARKodeMem ark_mem, sunbooleantype implicit)
{
  /* local data */
  ARKodeARKStepMem step_mem;
  int retval, i, j, jmax, nvec;
  sunrealtype* cj;
  sunrealtype** Aij;
  sunrealtype* cvals;
  N_Vector* Xvecs;

  /* access ARKodeARKStepMem structure */
  if (ark_mem->step_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARKSTEP_NO_MEM);
    return (ARK_MEM_NULL);
  }
  step_mem = (ARKodeARKStepMem)ark_mem->step_mem;

  /* Set shortcut to current stage index */
  i = step_mem->istage;

  /* local shortcuts for fused vector operations */
  cvals = step_mem->cvals;
  Xvecs = step_mem->Xvecs;

  /* Update gamma if stage is implicit */
  if (implicit)
  {
    step_mem->gamma = ark_mem->h * step_mem->Bi->A[i][i];
    if (ark_mem->firststage) { step_mem->gammap = step_mem->gamma; }
    step_mem->gamrat = (ark_mem->firststage)
                         ? ONE
                         : step_mem->gamma /
                             step_mem->gammap; /* protect x/x != 1.0 */
  }

  /* If implicit, initialize sdata to yn - zpred (here: zpred = zp), and set
     first entries for eventual N_VLinearCombination call */
  nvec = 0;
  if (implicit)
  {
    N_VLinearSum(ONE, ark_mem->yn, -ONE, step_mem->zpred, step_mem->sdata);
    cvals[0] = ONE;
    Xvecs[0] = step_mem->sdata;
    nvec     = 1;
  }

  /* If implicit with fixed M!=I, update sdata with M*sdata */
  if (implicit && (step_mem->mass_type == MASS_FIXED))
  {
    N_VScale(ONE, step_mem->sdata, ark_mem->tempv1);
    retval = step_mem->mmult((void*)ark_mem, ark_mem->tempv1, step_mem->sdata);
    if (retval != ARK_SUCCESS) { return (ARK_MASSMULT_FAIL); }
  }

  /* Update sdata with prior stage information */
  if (step_mem->explicit)
  { /* Explicit pieces */
    for (j = 0; j < i; j++)
    {
      cvals[nvec] = ark_mem->h * step_mem->Be->A[i][j];
      Xvecs[nvec] = step_mem->Fe[j];
      nvec += 1;
    }
  }
  if (step_mem->implicit)
  { /* Implicit pieces */
    for (j = 0; j < i; j++)
    {
      cvals[nvec] = ark_mem->h * step_mem->Bi->A[i][j];
      Xvecs[nvec] = step_mem->Fi[j];
      nvec += 1;
    }
  }

  /* apply external polynomial (MRI) forcing (M = I required) */
  if (step_mem->expforcing || step_mem->impforcing)
  {
    if (step_mem->expforcing)
    {
      jmax = i;
      Aij  = step_mem->Be->A;
      cj   = step_mem->Be->c;
    }
    else
    {
      jmax = i + 1;
      Aij  = step_mem->Bi->A;
      cj   = step_mem->Bi->c;
    }

    for (j = 0; j < jmax; j++)
    {
      step_mem->stage_times[j] = ark_mem->tn + cj[j] * ark_mem->h;
      step_mem->stage_coefs[j] = ark_mem->h * Aij[i][j];
    }

    arkStep_ApplyForcing(step_mem, step_mem->stage_times, step_mem->stage_coefs,
                         jmax, &nvec);
  }

  /* call fused vector operation to do the work */
  retval = N_VLinearCombination(nvec, cvals, Xvecs, step_mem->sdata);
  if (retval != 0) { return (ARK_VECTOROP_ERR); }

  /* return with success */
  return (ARK_SUCCESS);
}